

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O3

QString * __thiscall
QAccessibleTextWidget::attributes
          (QString *__return_storage_ptr__,QAccessibleTextWidget *this,int offset,int *startOffset,
          int *endOffset)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  MoveMode MVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QString *pQVar9;
  ulong extraout_RAX;
  char *pcVar10;
  storage_type *psVar11;
  QChar QVar12;
  MoveMode MVar13;
  char *pcVar14;
  long in_FS_OFFSET;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QBrush foreground;
  QBrush background;
  QTextCursor cursor;
  undefined1 *local_1a0;
  QArrayData *local_198;
  char *local_190;
  QArrayData *local_188 [3];
  QArrayData *local_170 [3];
  QArrayData *local_158;
  char *local_150;
  undefined1 *local_140;
  QArrayData *local_138;
  char16_t *pcStack_130;
  undefined8 local_128;
  QString local_118;
  undefined1 *local_100;
  QString local_f8;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [12];
  int iStack_9c;
  undefined1 *local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 local_78 [32];
  QString *local_58;
  char16_t local_50;
  char16_t local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (offset == -2) {
    offset = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0xe8))(this);
  }
  MVar4 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x118))(this);
  MVar13 = offset;
  if (offset == MVar4) {
    MVar13 = MVar4 - KeepAnchor;
  }
  if (offset == ~MoveAnchor) {
    MVar13 = MVar4 - KeepAnchor;
  }
  if ((int)MVar13 < 0 || (int)MVar4 < (int)MVar13) {
    *startOffset = -1;
    *endOffset = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0051f646;
  }
  local_100 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x158))(&local_100,this);
  QTextCursor::setPosition((int)&local_100,MVar13);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::block();
  iVar5 = QTextBlock::position();
  iVar6 = QTextBlock::length();
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff60 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::begin();
  iVar8 = iVar5;
  if ((int)local_98 != iStack_9c) {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::iterator::fragment();
    cVar3 = QTextFragment::contains((int)local_78);
    if (cVar3 == '\0') {
      do {
        iVar8 = QTextFragment::position();
        iVar7 = QTextFragment::length();
        QTextBlock::iterator::operator++((iterator *)local_a8);
        if ((int)local_98 == iStack_9c) break;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::iterator::fragment();
        cVar3 = QTextFragment::contains((int)local_78);
      } while (cVar3 == '\0');
      iVar8 = iVar7 + iVar8;
    }
  }
  iVar6 = iVar6 + iVar5;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_b8);
  if ((int)local_98 == iStack_9c) {
    QTextBlock::charFormat();
    QTextFormat::operator=((QTextFormat *)local_b8,(QTextFormat *)local_78);
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
    *startOffset = iVar8;
  }
  else {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::iterator::fragment();
    QTextFragment::charFormat();
    QTextFormat::operator=((QTextFormat *)local_b8,(QTextFormat *)&local_f8);
    QTextFormat::~QTextFormat((QTextFormat *)&local_f8);
    iVar8 = QTextFragment::position();
    if (iVar5 < iVar8) {
      iVar5 = iVar8;
    }
    *startOffset = iVar5;
    iVar5 = QTextFragment::length();
    if (iVar5 + iVar8 < iVar6) {
      iVar6 = iVar5 + iVar8;
    }
  }
  *endOffset = iVar6;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::font();
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (char16_t *)0x0;
  local_f8.d.size = 0;
  local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFont::families();
  if (local_78._16_8_ == 0) {
    local_118.d.d = (Data *)0x0;
    local_118.d.ptr = (char16_t *)0x0;
    local_118.d.size = 0;
  }
  else {
    local_118.d.d = ((DataPointer *)local_78._8_8_)->d;
    local_118.d.ptr = ((DataPointer *)local_78._8_8_)->ptr;
    local_118.d.size = ((DataPointer *)local_78._8_8_)->size;
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78);
  if (local_118.d.size != 0) {
    QVar15.m_data = (char *)0x2;
    QVar15.m_size = 0x5c;
    QVar12.ucs = (char16_t)&local_118;
    pQVar9 = (QString *)QString::replace(QVar12,QVar15,0x6e9f9e);
    QString::operator=(&local_118,pQVar9);
    QVar16.m_data = (char *)0x2;
    QVar16.m_size = 0x3a;
    pQVar9 = (QString *)QString::replace(QVar12,QVar16,0x6e9fa1);
    QString::operator=(&local_118,pQVar9);
    QVar17.m_data = (char *)0x2;
    QVar17.m_size = 0x2c;
    pQVar9 = (QString *)QString::replace(QVar12,QVar17,0x6e9fa4);
    QString::operator=(&local_118,pQVar9);
    QVar18.m_data = (char *)0x2;
    QVar18.m_size = 0x3d;
    pQVar9 = (QString *)QString::replace(QVar12,QVar18,0x6e9fa7);
    QString::operator=(&local_118,pQVar9);
    QVar19.m_data = (char *)0x2;
    QVar19.m_size = 0x3b;
    pQVar9 = (QString *)QString::replace(QVar12,QVar19,0x6e9faa);
    QString::operator=(&local_118,pQVar9);
    QVar20.m_data = (char *)0x2;
    QVar20.m_size = 0x22;
    pQVar9 = (QString *)QString::replace(QVar12,QVar20,0x6e9fad);
    QString::operator=(&local_118,pQVar9);
    local_78._24_2_ = 0x22;
    local_50 = L'\"';
    local_78._0_8_ = &DAT_0000000b;
    local_78._8_8_ = "font-family";
    local_78._16_2_ = 0x3a;
    local_48 = L';';
    local_58 = &local_118;
    operator+=(&local_f8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t>_>,_char16_t>
                *)local_78);
  }
  iVar6 = QFont::pointSize();
  if (iVar6 != 0) {
    QVar21.m_data = (storage_type *)0x4;
    QVar21.m_size = (qsizetype)&local_138;
    QString::fromLatin1(QVar21);
    QString::arg_impl((longlong)local_78,(int)&local_138,iVar6,(QChar)0x0);
    local_158 = (QArrayData *)&local_f8;
    local_150 = "font-size";
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_158,(QString *)local_78);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    if (local_138 != (QArrayData *)0x0) {
      LOCK();
      (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_138,2,0x10);
      }
    }
  }
  iVar6 = QFont::weight();
  pcVar10 = "bold";
  pcVar14 = "normal";
  if (iVar6 < 0x191) {
    pcVar10 = "normal";
  }
  psVar11 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar1 = psVar11 + (long)(pcVar10 + 1);
    psVar11 = psVar11 + 1;
  } while (*pcVar1 != '\0');
  QVar22.m_data = psVar11;
  QVar22.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar22);
  pcStack_130 = L"font-weight";
  local_138 = (QArrayData *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_138,(QString *)local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  iVar6 = QFont::style();
  if (iVar6 == 2) {
    pcVar14 = "oblique";
  }
  pcVar10 = "italic";
  if (iVar6 != 1) {
    pcVar10 = pcVar14;
  }
  psVar11 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar14 = psVar11 + (long)(pcVar10 + 1);
    psVar11 = psVar11 + 1;
  } while (*pcVar14 != '\0');
  QVar23.m_data = psVar11;
  QVar23.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar23);
  pcStack_130 = L"font-style";
  local_138 = (QArrayData *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_138,(QString *)local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  bVar2 = QFont::strikeOut();
  local_78._24_8_ = (ulong)bVar2 * 2 + 4;
  local_58 = (QString *)0x667c4c;
  if (bVar2 != 0) {
    local_58 = (QString *)0x6e9ffd;
  }
  local_78._0_8_ = (QArrayData *)0x16;
  local_78._8_8_ = "text-line-through-type";
  local_78._16_2_ = 0x3a;
  local_50 = L';';
  operator+=(&local_f8,
             (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QLatin1String>,_char16_t>
              *)local_78);
  iVar6 = QTextFormat::intProperty((int)local_b8);
  if (iVar6 == 0) {
    cVar3 = QFont::underline();
    if (cVar3 != '\0') goto switchD_0051eea2_caseD_1;
    local_138 = (QArrayData *)0x0;
    pcStack_130 = (char16_t *)0x0;
    local_128 = 0;
    goto LAB_0051efbd;
  }
  local_138 = (QArrayData *)0x0;
  pcStack_130 = (char16_t *)0x0;
  local_128 = 0;
  switch(iVar6) {
  case 1:
switchD_0051eea2_caseD_1:
    local_138 = (QArrayData *)0x0;
    pcStack_130 = L"solid";
    local_128 = 5;
    break;
  case 2:
  case 3:
    pcStack_130 = L"dash";
    goto LAB_0051ef13;
  case 4:
    pcStack_130 = L"dot-dash";
    local_128 = 8;
    break;
  case 5:
    pcStack_130 = L"dot-dot-dash";
    local_128 = 0xc;
    break;
  case 6:
  case 7:
    pcStack_130 = L"wave";
LAB_0051ef13:
    local_128 = 4;
    break;
  default:
    attributes();
    if ((extraout_RAX & 1) != 0) goto LAB_0051efbd;
  }
  local_78._0_8_ = (Data *)0x14;
  local_78._8_8_ = "text-underline-style";
  local_78._16_2_ = 0x3a;
  local_58 = (QString *)CONCAT62(local_58._2_6_,0x3b);
  local_78._24_8_ = (AttributeFormatterRef *)&local_138;
  operator+=(&local_f8,
             (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QString_&>,_char16_t>
              *)local_78);
  local_78._0_8_ = (QArrayData *)0x0;
  local_78._8_8_ = L"single";
  local_78._16_8_ = 6;
  local_150 = "text-underline-type";
  local_158 = (QArrayData *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_158,(QString *)local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
LAB_0051efbd:
  iVar6 = QTextBlock::textDirection();
  if (iVar6 == 1) {
    local_78._0_8_ = (QArrayData *)0x0;
    local_78._8_8_ = L"rl";
    local_78._16_8_ = 2;
    local_150 = "writing-mode";
    local_158 = (QArrayData *)&local_f8;
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_158,(QString *)local_78);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
  }
  iVar6 = QTextFormat::intProperty((int)local_b8);
  pcVar10 = "baseline";
  if (iVar6 == 1) {
    pcVar10 = "super";
  }
  pcVar14 = "sub";
  if (iVar6 != 2) {
    pcVar14 = pcVar10;
  }
  psVar11 = (storage_type *)0xffffffffffffffff;
  do {
    pcVar10 = psVar11 + (long)(pcVar14 + 1);
    psVar11 = psVar11 + 1;
  } while (*pcVar10 != '\0');
  QVar24.m_data = psVar11;
  QVar24.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar24);
  local_150 = "text-position";
  local_158 = (QArrayData *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_158,(QString *)local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  local_140 = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::brushProperty((int)&local_140);
  if (*(int *)(local_140 + 4) == 1) {
    QVar25.m_data = (storage_type *)0xd;
    QVar25.m_size = (qsizetype)local_188;
    QString::fromLatin1(QVar25);
    iVar6 = QColor::red();
    QString::arg_impl((longlong)local_170,(int)local_188,iVar6,(QChar)0x0);
    iVar6 = QColor::green();
    QString::arg_impl((longlong)&local_158,(int)local_170,iVar6,(QChar)0x0);
    iVar6 = QColor::blue();
    QString::arg_impl((longlong)local_78,(int)&local_158,iVar6,(QChar)0x0);
    local_190 = "background-color";
    local_198 = (QArrayData *)&local_f8;
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_198,(QString *)local_78);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    if (local_158 != (QArrayData *)0x0) {
      LOCK();
      (local_158->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_158->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_158->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_158,2,0x10);
      }
    }
    if (local_170[0] != (QArrayData *)0x0) {
      LOCK();
      (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_170[0],2,0x10);
      }
    }
    if (local_188[0] != (QArrayData *)0x0) {
      LOCK();
      (local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_188[0],2,0x10);
      }
    }
  }
  local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::brushProperty((int)&local_1a0);
  if (*(int *)(local_1a0 + 4) == 1) {
    QVar26.m_data = (storage_type *)0xd;
    QVar26.m_size = (qsizetype)local_188;
    QString::fromLatin1(QVar26);
    iVar6 = QColor::red();
    QString::arg_impl((longlong)local_170,(int)local_188,iVar6,(QChar)0x0);
    iVar6 = QColor::green();
    QString::arg_impl((longlong)&local_158,(int)local_170,iVar6,(QChar)0x0);
    iVar6 = QColor::blue();
    QString::arg_impl((longlong)local_78,(int)&local_158,iVar6,(QChar)0x0);
    local_190 = "color";
    local_198 = (QArrayData *)&local_f8;
    (anonymous_namespace)::AttributeFormatterRef::operator=
              ((AttributeFormatterRef *)&local_198,(QString *)local_78);
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    if (local_158 != (QArrayData *)0x0) {
      LOCK();
      (local_158->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_158->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_158->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_158,2,0x10);
      }
    }
    if (local_170[0] != (QArrayData *)0x0) {
      LOCK();
      (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_170[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_170[0],2,0x10);
      }
    }
    if (local_188[0] != (QArrayData *)0x0) {
      LOCK();
      (local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_188[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_188[0],2,0x10);
      }
    }
  }
  iVar6 = QTextFormat::intProperty((int)&local_c8);
  switch(iVar6 + (uint)(iVar6 == 0) & 0xf) {
  case 1:
    local_78._8_8_ = L"left";
    local_78._16_8_ = 4;
    break;
  case 2:
    local_78._8_8_ = L"right";
    local_78._16_8_ = 5;
    break;
  default:
    goto switchD_0051f3fc_caseD_3;
  case 4:
    local_78._8_8_ = L"center";
    local_78._16_8_ = 6;
    break;
  case 8:
    local_78._8_8_ = L"justify";
    local_78._16_8_ = 7;
  }
  local_78._0_8_ = (QArrayData *)0x0;
  local_150 = "text-align";
  local_158 = (QArrayData *)&local_f8;
  (anonymous_namespace)::AttributeFormatterRef::operator=
            ((AttributeFormatterRef *)&local_158,(QString *)local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
switchD_0051f3fc_caseD_3:
  (__return_storage_ptr__->d).d = local_f8.d.d;
  (__return_storage_ptr__->d).ptr = local_f8.d.ptr;
  (__return_storage_ptr__->d).size = local_f8.d.size;
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QBrush::~QBrush((QBrush *)&local_1a0);
  QBrush::~QBrush((QBrush *)&local_140);
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,0x10);
    }
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QFont::~QFont((QFont *)&local_d8);
  QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
  QTextFormat::~QTextFormat((QTextFormat *)local_b8);
  QTextCursor::~QTextCursor((QTextCursor *)&local_100);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0051f646:
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTextWidget::attributes(int offset, int *startOffset, int *endOffset) const
{
    /* The list of attributes can be found at:
     http://linuxfoundation.org/collaborate/workgroups/accessibility/iaccessible2/textattributes
    */

    // IAccessible2 defines -1 as length and -2 as cursor position
    if (offset == -2)
        offset = cursorPosition();

    const int charCount = characterCount();

    // -1 doesn't make much sense here, but it's better to return something
    // screen readers may ask for text attributes at the cursor pos which may be equal to length
    if (offset == -1 || offset == charCount)
        offset = charCount - 1;

    if (offset < 0 || offset > charCount) {
        *startOffset = -1;
        *endOffset = -1;
        return QString();
    }


    QTextCursor cursor = textCursor();
    cursor.setPosition(offset);
    QTextBlock block = cursor.block();

    int blockStart = block.position();
    int blockEnd = blockStart + block.length();

    QTextBlock::iterator iter = block.begin();
    int lastFragmentIndex = blockStart;
    while (!iter.atEnd()) {
        QTextFragment f = iter.fragment();
        if (f.contains(offset))
            break;
        lastFragmentIndex = f.position() + f.length();
        ++iter;
    }

    QTextCharFormat charFormat;
    if (!iter.atEnd()) {
        QTextFragment fragment = iter.fragment();
        charFormat = fragment.charFormat();
        int pos = fragment.position();
        // text block and fragment may overlap, use the smallest common range
        *startOffset = qMax(pos, blockStart);
        *endOffset = qMin(pos + fragment.length(), blockEnd);
    } else {
        charFormat = block.charFormat();
        *startOffset = lastFragmentIndex;
        *endOffset = blockEnd;
    }
    Q_ASSERT(*startOffset <= offset);
    Q_ASSERT(*endOffset >= offset);

    QTextBlockFormat blockFormat = cursor.blockFormat();

    const QFont charFormatFont = charFormat.font();

    AttributeFormatter attrs;
    QString family = charFormatFont.families().value(0, QString());
    if (!family.isEmpty()) {
        family = family.replace(u'\\', "\\\\"_L1);
        family = family.replace(u':', "\\:"_L1);
        family = family.replace(u',', "\\,"_L1);
        family = family.replace(u'=', "\\="_L1);
        family = family.replace(u';', "\\;"_L1);
        family = family.replace(u'\"', "\\\""_L1);
        attrs["font-family"] = u'"' + family + u'"';
    }

    int fontSize = int(charFormatFont.pointSize());
    if (fontSize)
        attrs["font-size"] = QString::fromLatin1("%1pt").arg(fontSize);

    //Different weight values are not handled
    attrs["font-weight"] = QString::fromLatin1(charFormatFont.weight() > QFont::Normal ? "bold" : "normal");

    QFont::Style style = charFormatFont.style();
    attrs["font-style"] = QString::fromLatin1((style == QFont::StyleItalic) ? "italic" : ((style == QFont::StyleOblique) ? "oblique": "normal"));

    attrs["text-line-through-type"] = charFormatFont.strikeOut() ? "single"_L1 : "none"_L1;

    QTextCharFormat::UnderlineStyle underlineStyle = charFormat.underlineStyle();
    if (underlineStyle == QTextCharFormat::NoUnderline && charFormatFont.underline()) // underline could still be set in the default font
        underlineStyle = QTextCharFormat::SingleUnderline;
    QString underlineStyleValue;
    switch (underlineStyle) {
        case QTextCharFormat::NoUnderline:
            break;
        case QTextCharFormat::SingleUnderline:
            underlineStyleValue = QStringLiteral("solid");
            break;
        case QTextCharFormat::DashUnderline:
            underlineStyleValue = QStringLiteral("dash");
            break;
        case QTextCharFormat::DotLine:
            underlineStyleValue = QStringLiteral("dash");
            break;
        case QTextCharFormat::DashDotLine:
            underlineStyleValue = QStringLiteral("dot-dash");
            break;
        case QTextCharFormat::DashDotDotLine:
            underlineStyleValue = QStringLiteral("dot-dot-dash");
            break;
        case QTextCharFormat::WaveUnderline:
            underlineStyleValue = QStringLiteral("wave");
            break;
        case QTextCharFormat::SpellCheckUnderline:
            underlineStyleValue = QStringLiteral("wave"); // this is not correct, but provides good approximation at least
            break;
        default:
            qWarning() << "Unknown QTextCharFormat::UnderlineStyle value " << underlineStyle << " could not be translated to IAccessible2 value";
            break;
    }
    if (!underlineStyleValue.isNull()) {
        attrs["text-underline-style"] = underlineStyleValue;
        attrs["text-underline-type"] = QStringLiteral("single"); // if underlineStyleValue is set, there is an underline, and Qt does not support other than single ones
    } // else both are "none" which is the default - no need to set them

    if (block.textDirection() == Qt::RightToLeft)
        attrs["writing-mode"] = QStringLiteral("rl");

    QTextCharFormat::VerticalAlignment alignment = charFormat.verticalAlignment();
    attrs["text-position"] = QString::fromLatin1((alignment == QTextCharFormat::AlignSubScript) ? "sub" : ((alignment == QTextCharFormat::AlignSuperScript) ? "super" : "baseline" ));

    QBrush background = charFormat.background();
    if (background.style() == Qt::SolidPattern) {
        attrs["background-color"] = QString::fromLatin1("rgb(%1,%2,%3)").arg(background.color().red()).arg(background.color().green()).arg(background.color().blue());
    }

    QBrush foreground = charFormat.foreground();
    if (foreground.style() == Qt::SolidPattern) {
        attrs["color"] = QString::fromLatin1("rgb(%1,%2,%3)").arg(foreground.color().red()).arg(foreground.color().green()).arg(foreground.color().blue());
    }

    switch (blockFormat.alignment() & (Qt::AlignLeft | Qt::AlignRight | Qt::AlignHCenter | Qt::AlignJustify)) {
    case Qt::AlignLeft:
        attrs["text-align"] = QStringLiteral("left");
        break;
    case Qt::AlignRight:
        attrs["text-align"] = QStringLiteral("right");
        break;
    case Qt::AlignHCenter:
        attrs["text-align"] = QStringLiteral("center");
        break;
    case Qt::AlignJustify:
        attrs["text-align"] = QStringLiteral("justify");
        break;
    }

    return attrs.toFormatted();
}